

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

OPJ_UINT32
opj_t1_getctxtno_sc_or_spb_index(OPJ_UINT32 fX,OPJ_UINT32 pfX,OPJ_UINT32 nfX,OPJ_UINT32 ci)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = (byte)(ci * 3);
  bVar2 = 0xe;
  if (ci != 0) {
    bVar2 = bVar1 + 0xc;
  }
  return (uint)((pfX >> (ci * 3 + 0x13 & 0x1f) & 1) != 0) | fX >> (bVar1 & 0x1f) & 0xaa |
         nfX >> (bVar1 + 0x11 & 0x1f) & 4 | fX >> (bVar1 + 0x10 & 0x1f) & 0x40 |
         fX >> (bVar2 & 0x1f) & 0x10;
}

Assistant:

static INLINE OPJ_UINT32 opj_t1_getctxtno_sc_or_spb_index(OPJ_UINT32 fX,
        OPJ_UINT32 pfX,
        OPJ_UINT32 nfX,
        OPJ_UINT32 ci)
{
    /*
      0 pfX T1_CHI_THIS           T1_LUT_SGN_W
      1 tfX T1_SIGMA_1            T1_LUT_SIG_N
      2 nfX T1_CHI_THIS           T1_LUT_SGN_E
      3 tfX T1_SIGMA_3            T1_LUT_SIG_W
      4  fX T1_CHI_(THIS - 1)     T1_LUT_SGN_N
      5 tfX T1_SIGMA_5            T1_LUT_SIG_E
      6  fX T1_CHI_(THIS + 1)     T1_LUT_SGN_S
      7 tfX T1_SIGMA_7            T1_LUT_SIG_S
    */

    OPJ_UINT32 lu = (fX >> (ci * 3U)) & (T1_SIGMA_1 | T1_SIGMA_3 | T1_SIGMA_5 |
                                         T1_SIGMA_7);

    lu |= (pfX >> (T1_CHI_THIS_I      + (ci * 3U))) & (1U << 0);
    lu |= (nfX >> (T1_CHI_THIS_I - 2U + (ci * 3U))) & (1U << 2);
    if (ci == 0U) {
        lu |= (fX >> (T1_CHI_0_I - 4U)) & (1U << 4);
    } else {
        lu |= (fX >> (T1_CHI_1_I - 4U + ((ci - 1U) * 3U))) & (1U << 4);
    }
    lu |= (fX >> (T1_CHI_2_I - 6U + (ci * 3U))) & (1U << 6);
    return lu;
}